

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  anon_class_8_1_98a85fda *o;
  VoidPtr ptr_local;
  
  std::
  invoke_abi_cxx11_<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__2_const&>
            (__return_storage_ptr__,(anon_class_8_1_98a85fda *)this);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}